

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BasicTexImage2DCase::createTexture(BasicTexImage2DCase *this)

{
  int internalFormat;
  deUint32 type;
  deUint32 dVar1;
  int width;
  int height;
  char *str;
  void *data;
  PixelBufferAccess local_e0;
  PixelBufferAccess local_b8;
  undefined1 local_90 [8];
  Vec4 gMax;
  Vec4 gMin;
  int levelH;
  int levelW;
  int ndx;
  undefined1 local_58 [8];
  Random rnd;
  undefined1 local_40 [8];
  TextureLevel levelData;
  deUint32 tex;
  BasicTexImage2DCase *this_local;
  
  levelData.m_data.m_cap._4_4_ = 0;
  rnd.m_rnd._8_8_ = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_40,(TextureFormat *)&rnd.m_rnd.z);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(str);
  de::Random::Random((Random *)local_58,dVar1);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)((long)&levelData.m_data.m_cap + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
             levelData.m_data.m_cap._4_4_);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,1);
  for (levelH = 0; levelH < (this->super_Texture2DSpecCase).m_numLevels; levelH = levelH + 1) {
    width = de::max<int>(1,(this->super_Texture2DSpecCase).m_width >> ((byte)levelH & 0x1f));
    height = de::max<int>(1,(this->super_Texture2DSpecCase).m_height >> ((byte)levelH & 0x1f));
    randomVector<4>((Functional *)(gMax.m_data + 2),(Random *)local_58,
                    &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin,
                    &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax);
    randomVector<4>((Functional *)local_90,(Random *)local_58,
                    &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin,
                    &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax);
    tcu::TextureLevel::setSize((TextureLevel *)local_40,width,height,1);
    tcu::TextureLevel::getAccess(&local_b8,(TextureLevel *)local_40);
    tcu::fillWithComponentGradients(&local_b8,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_90);
    internalFormat = *(int *)&(this->super_Texture2DSpecCase).field_0xd4;
    dVar1 = this->m_format;
    type = this->m_dataType;
    tcu::TextureLevel::getAccess(&local_e0,(TextureLevel *)local_40);
    data = tcu::PixelBufferAccess::getDataPtr(&local_e0);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
               levelH,internalFormat,width,height,0,dVar1,type,data);
  }
  de::Random::~Random((Random *)local_58);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_40);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(m_format, m_dataType));
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}